

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  string *psVar1;
  byte bVar2;
  bool bVar3;
  ArrayIndex AVar4;
  Value *pVVar5;
  Value *pVVar6;
  uint uVar7;
  long lVar8;
  LargestUInt value_00;
  LargestInt value_01;
  pointer pbVar9;
  char *pcVar10;
  char cVar11;
  ArrayIndex index;
  Json *pJVar12;
  double value_02;
  Members members;
  string local_68;
  Members local_48;
  
  bVar2 = (byte)*(ushort *)&value->field_0x8;
  if (7 < bVar2) {
    return;
  }
  lVar8 = (long)&switchD_00116915::switchdataD_0011fc6c +
          (long)(int)(&switchD_00116915::switchdataD_0011fc6c)[bVar2];
  uVar7 = (uint)lVar8;
  switch(bVar2) {
  case 0:
    if (this->dropNullPlaceholders_ != false) {
      return;
    }
    std::__cxx11::string::append((char *)&this->document_);
    return;
  case 1:
    pJVar12 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar12,value_01);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 2:
    pJVar12 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar12,value_00);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 3:
    value_02 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_68,(Json *)0x0,value_02,true,uVar7);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 4:
    uVar7 = (uint)CONCAT71((int7)((ulong)lVar8 >> 8),bVar2 == 4);
    pJVar12 = (Json *)(value->value_).string_;
    if (pJVar12 == (Json *)0x0 || bVar2 != 4) {
      return;
    }
    if ((*(ushort *)&value->field_0x8 >> 8 & 1) == 0) {
      pcVar10 = (char *)strlen((char *)pJVar12);
    }
    else {
      pcVar10 = (char *)(ulong)*(uint *)pJVar12;
      pJVar12 = pJVar12 + 4;
    }
    valueToQuotedStringN_abi_cxx11_(&local_68,pJVar12,pcVar10,uVar7);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 5:
    bVar3 = Value::asBool(value);
    pcVar10 = "false";
    if (bVar3) {
      pcVar10 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar10,pcVar10 + ((ulong)bVar3 ^ 5));
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_00116bf1;
  case 6:
    cVar11 = (char)this + '\b';
    std::__cxx11::string::push_back(cVar11);
    AVar4 = Value::size(value);
    if (AVar4 != 0) {
      index = 0;
      do {
        if (index != 0) {
          std::__cxx11::string::push_back(cVar11);
        }
        pVVar6 = Value::operator[](value,index);
        writeValue(this,pVVar6);
        index = index + 1;
      } while (AVar4 != index);
    }
    std::__cxx11::string::push_back(cVar11);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    psVar1 = &this->document_;
    cVar11 = (char)psVar1;
    std::__cxx11::string::push_back(cVar11);
    pbVar9 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (pbVar9 != local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::push_back(cVar11);
        }
        valueToQuotedStringN_abi_cxx11_
                  (&local_68,(Json *)(pbVar9->_M_dataplus)._M_p,
                   (char *)(ulong)(uint)pbVar9->_M_string_length,(uint)lVar8);
        std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)psVar1);
        pcVar10 = (pbVar9->_M_dataplus)._M_p;
        pVVar5 = Value::find(value,pcVar10,pcVar10 + pbVar9->_M_string_length);
        pVVar6 = (Value *)kNull;
        if (pVVar5 != (Value *)0x0) {
          pVVar6 = pVVar5;
        }
        writeValue(this,pVVar6);
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::push_back(cVar11);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    return;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00116bf1:
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FastWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    if (!dropNullPlaceholders_)
      document_ += "null";
    break;
  case intValue:
    document_ += valueToString(value.asLargestInt());
    break;
  case uintValue:
    document_ += valueToString(value.asLargestUInt());
    break;
  case realValue:
    document_ += valueToString(value.asDouble());
    break;
  case stringValue:
  {
    // Is NULL possible for value.string_?
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) document_ += valueToQuotedStringN(str, static_cast<unsigned>(end-str));
    break;
  }
  case booleanValue:
    document_ += valueToString(value.asBool());
    break;
  case arrayValue: {
    document_ += '[';
    ArrayIndex size = value.size();
    for (ArrayIndex index = 0; index < size; ++index) {
      if (index > 0)
        document_ += ',';
      writeValue(value[index]);
    }
    document_ += ']';
  } break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    document_ += '{';
    for (Value::Members::iterator it = members.begin(); it != members.end();
         ++it) {
      const JSONCPP_STRING& name = *it;
      if (it != members.begin())
        document_ += ',';
      document_ += valueToQuotedStringN(name.data(), static_cast<unsigned>(name.length()));
      document_ += yamlCompatiblityEnabled_ ? ": " : ":";
      writeValue(value[name]);
    }
    document_ += '}';
  } break;
  }
}